

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ProtocolMACEthernet.cpp
# Opt level: O0

void __thiscall
ProtocolMACEthernet::ProcessRx(ProtocolMACEthernet *this,uint8_t *buffer,int actualLength)

{
  undefined2 uVar1;
  bool bVar2;
  uint16_t uVar3;
  DataBuffer *this_00;
  size_t sVar4;
  int local_3c;
  int local_2c;
  int length;
  int i;
  DataBuffer *packet;
  uint16_t type;
  int actualLength_local;
  uint8_t *buffer_local;
  ProtocolMACEthernet *this_local;
  
  this_00 = (DataBuffer *)osQueue::Get(&this->RxBufferQueue);
  local_3c = actualLength;
  if (0x200 < actualLength) {
    local_3c = 0x200;
  }
  if (this_00 == (DataBuffer *)0x0) {
    printf("ProtocolMACEthernet::ProcessRx Out of receive buffers\n");
  }
  else if (local_3c < 0x201) {
    DataBuffer::Initialize(this_00,&this->super_InterfaceMAC);
    for (local_2c = 0; local_2c < local_3c; local_2c = local_2c + 1) {
      this_00->Packet[local_2c] = buffer[local_2c];
    }
    this_00->Length = (uint16_t)local_3c;
    uVar3 = Unpack16(this_00->Packet,0xc);
    bVar2 = IsLocalAddress(this,this_00->Packet);
    if (bVar2) {
      if (local_3c < actualLength) {
        osQueue::Put(&this->RxBufferQueue,this_00);
        return;
      }
      sVar4 = header_size();
      this_00->Packet = this_00->Packet + sVar4;
      sVar4 = header_size();
      uVar1 = this_00->Length;
      this_00->Length = uVar1 - (short)sVar4;
      if (uVar3 == 0x800) {
        ProtocolIPv4::ProcessRx(this->IPv4,this_00);
      }
      else if (uVar3 == 0x806) {
        ProtocolARP::ProcessRx(this->ARP,this_00);
      }
    }
    if ((this_00->Disposable & 1U) != 0) {
      osQueue::Put(&this->RxBufferQueue,this_00);
    }
  }
  else {
    osQueue::Put(&this->RxBufferQueue,this_00);
  }
  return;
}

Assistant:

void ProtocolMACEthernet::ProcessRx(uint8_t* buffer, int actualLength)
{
    uint16_t type;
    DataBuffer* packet = (DataBuffer*)RxBufferQueue.Get();
    int i;
    int length =
        (DATA_BUFFER_PAYLOAD_SIZE < actualLength ? DATA_BUFFER_PAYLOAD_SIZE : actualLength);

    if (packet == nullptr)
    {
        printf("ProtocolMACEthernet::ProcessRx Out of receive buffers\n");
        return;
    }

    if (length > DATA_BUFFER_PAYLOAD_SIZE)
    {
        // printf("ProtocolMACEthernet::ProcessRx Rx data overrun %d, %d\n",
        //        length,
        //        DATA_BUFFER_PAYLOAD_SIZE);
        RxBufferQueue.Put(packet);
        return;
    }

    packet->Initialize(this);

    for (i = 0; i < length; i++)
    {
        packet->Packet[i] = buffer[i];
    }
    packet->Length = length;

    type = Unpack16(packet->Packet, 12);

    // Check if the MAC Address is destined for me
    if (IsLocalAddress(packet->Packet))
    {
        // DumpData( buffer, length, printf );
        if (actualLength > length)
        {
            // printf("ProtocolMACEthernet::ProcessRx Rx data overrun %d, %d\n",
            //        length,
            //        DATA_BUFFER_PAYLOAD_SIZE);
            // printf("Unicast type 0x%04X\n", type);
            RxBufferQueue.Put(packet);
            return;
        }
        // Unicast
        packet->Packet += header_size();
        packet->Length -= header_size();

        switch (type)
        {
        case 0x0800: // IP
            IPv4.ProcessRx(packet);
            break;
        case 0x0806: // ARP
            ARP.ProcessRx(packet);
            break;
        default:
            // printf( "Unsupported Unicast type 0x%04X\n", type );
            break;
        }
    }

    if (packet->Disposable)
    {
        RxBufferQueue.Put(packet);
    }
}